

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_expression_delete.hpp
# Opt level: O2

void __thiscall
optimization::common_expr_del::BlockNodes::export_insts(BlockNodes *this,BasicBlk *block)

{
  optional<mir::inst::VarId> *this_00;
  __index_type _Var1;
  element_type *peVar2;
  variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__v;
  pointer pvVar3;
  Inst *pIVar4;
  long lVar5;
  vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
  *this_01;
  BasicBlk *pBVar6;
  int iVar7;
  Value *pVVar8;
  variant_alternative_t<1UL,_variant<Op,_ExtraNormOp,_InNormOp>_> *pvVar9;
  variant_alternative_t<2UL,_variant<Op,_ExtraNormOp,_InNormOp>_> *pvVar10;
  variant_alternative_t<2UL,_variant<int,_NodeId,_basic_string<char>_>_> *pvVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar12;
  variant_alternative_t<1UL,_variant<int,_NodeId,_basic_string<char>_>_> *pvVar13;
  variant_alternative_t<1UL,_variant<int,_VarId>_> *pvVar14;
  uint32_t *puVar15;
  VarId *pVVar16;
  mapped_type *pmVar17;
  mapped_type *pmVar18;
  _List_node_base *p_Var19;
  list<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *plVar20;
  long lVar21;
  list<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *plVar22;
  uint32_t uVar23;
  pointer pvVar24;
  uint uVar25;
  pointer psVar26;
  ulong uVar27;
  pointer __args;
  __single_object opInst;
  __single_object loadInst;
  VarId varId;
  __single_object assignInst;
  iterator __end2;
  Var_Replace vp;
  undefined1 local_2e8 [24];
  undefined1 local_2d0;
  undefined2 local_2cf;
  _List_node_base *local_2c8;
  vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
  *local_2c0;
  undefined1 local_2b8 [16];
  pointer local_2a8;
  undefined1 local_298 [8];
  variant<int,_mir::inst::VarId> vStack_290;
  undefined1 local_270 [16];
  _Head_base<0UL,_mir::inst::Inst_*,_false> local_260;
  _Head_base<0UL,_mir::inst::OpInst_*,_false> local_258;
  BasicBlk *local_250;
  undefined1 local_248 [8];
  variant<int,_mir::inst::VarId> local_240;
  __index_type local_228;
  VarId local_1e0;
  VarId local_1d0;
  _Variant_storage<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1c0;
  _Variant_storage<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_198;
  _Variant_storage<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_170;
  _Variant_storage<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_148;
  _Variant_storage<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_120;
  _Variant_storage<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f8;
  _Variant_storage<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  _Variant_storage<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  _Variant_storage<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  _Variant_storage<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  
  local_250 = block;
  for (psVar26 = (this->nodes).
                 super__Vector_base<std::shared_ptr<optimization::common_expr_del::Node>,_std::allocator<std::shared_ptr<optimization::common_expr_del::Node>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      psVar26 !=
      (this->nodes).
      super__Vector_base<std::shared_ptr<optimization::common_expr_del::Node>,_std::allocator<std::shared_ptr<optimization::common_expr_del::Node>_>_>
      ._M_impl.super__Vector_impl_data._M_finish; psVar26 = psVar26 + 1) {
    Node::init_main_var((psVar26->
                        super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr);
  }
  while (uVar27 = (long)psVar26 -
                  (long)(this->nodes).
                        super__Vector_base<std::shared_ptr<optimization::common_expr_del::Node>,_std::allocator<std::shared_ptr<optimization::common_expr_del::Node>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4,
        (this->added)._M_t._M_impl.super__Rb_tree_header._M_node_count < uVar27) {
    while( true ) {
      uVar25 = (int)uVar27 - 1;
      uVar27 = (ulong)uVar25;
      if ((int)uVar25 < 0) break;
      exportNode(this,uVar25);
    }
    psVar26 = (this->nodes).
              super__Vector_base<std::shared_ptr<optimization::common_expr_del::Node>,_std::allocator<std::shared_ptr<optimization::common_expr_del::Node>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  }
  local_2c0 = (vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
               *)&local_250->inst;
  std::
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ::clear((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
           *)local_2c0);
  p_Var19 = (_List_node_base *)&this->exportQueue;
  std::__reverse<std::_List_iterator<unsigned_int>>
            ((this->exportQueue).super__List_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl._M_node.super__List_node_base._M_next,p_Var19);
  local_258._M_head_impl = (OpInst *)&PTR_display_001dafa8;
  local_270._8_8_ = p_Var19;
  while (p_Var19 = (((_List_base<unsigned_int,_std::allocator<unsigned_int>_> *)&p_Var19->_M_next)->
                   _M_impl)._M_node.super__List_node_base._M_next,
        p_Var19 != (_List_node_base *)local_270._8_8_) {
    psVar26 = (this->nodes).
              super__Vector_base<std::shared_ptr<optimization::common_expr_del::Node>,_std::allocator<std::shared_ptr<optimization::common_expr_del::Node>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    peVar2 = psVar26[*(uint *)&p_Var19[1]._M_next].
             super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if (peVar2->is_leaf == false) {
      psVar26 = psVar26 + *(uint *)&p_Var19[1]._M_next;
      _Var1 = (peVar2->op).
              super__Variant_base<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
              .
              super__Move_assign_alias<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
              .
              super__Copy_assign_alias<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
              .
              super__Move_ctor_alias<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
              .
              super__Copy_ctor_alias<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
              .
              super__Variant_storage_alias<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
              ._M_index;
      local_2c8 = p_Var19;
      if (_Var1 == '\x02') {
        pvVar10 = std::
                  get<2ul,mir::inst::Op,optimization::common_expr_del::ExtraNormOp,optimization::common_expr_del::InNormOp>
                            (&peVar2->op);
        if (*pvVar10 == Call) {
          pvVar11 = std::get<2ul,int,optimization::common_expr_del::NodeId,std::__cxx11::string>
                              ((((psVar26->
                                 super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                                 )._M_ptr)->operands).
                               super__Vector_base<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish + 0xffffffffffffffff);
          std::__cxx11::string::string((string *)local_298,(string *)pvVar11);
          std::
          vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::pop_back(&((psVar26->
                       super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr)->operands);
          local_2a8 = (pointer)0x0;
          local_2b8._0_8_ =
               (__uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>)0x0;
          local_2b8._8_8_ = (pointer)0x0;
          peVar2 = (psVar26->
                   super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr;
          pvVar3 = (peVar2->operands).
                   super__Vector_base<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (pvVar24 = *(pointer *)&peVar2->operands; pvVar24 != pvVar3; pvVar24 = pvVar24 + 1) {
            std::__detail::__variant::
            _Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)local_248,
                              (_Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)pvVar24);
            std::__detail::__variant::
            _Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&local_1c0,
                              (_Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)local_248);
            convert_operand_to_value((Value *)local_2e8,this,(Operand *)&local_1c0);
            std::vector<mir::inst::Value,_std::allocator<mir::inst::Value>_>::
            emplace_back<mir::inst::Value>
                      ((vector<mir::inst::Value,_std::allocator<mir::inst::Value>_> *)local_2b8,
                       (Value *)local_2e8);
            std::__detail::__variant::
            _Variant_storage<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~_Variant_storage(&local_1c0);
            std::__detail::__variant::
            _Variant_storage<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~_Variant_storage((_Variant_storage<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)local_248);
          }
          pbVar12 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    std::get<1ul,int,mir::inst::VarId>
                              ((variant<int,_mir::inst::VarId> *)
                               &(((psVar26->
                                  super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                                  )._M_ptr)->mainVar).field_0x8);
          std::
          make_unique<mir::inst::CallInst,mir::inst::VarId&,std::__cxx11::string&,std::vector<mir::inst::Value,std::allocator<mir::inst::Value>>&>
                    ((VarId *)local_248,pbVar12,
                     (vector<mir::inst::Value,_std::allocator<mir::inst::Value>_> *)local_298);
          local_2e8._0_8_ = local_248;
          local_248 = (undefined1  [8])0x0;
          std::
          vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
          ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                    (local_2c0,
                     (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)local_2e8
                    );
          if ((__uniq_ptr_impl<mir::inst::OpInst,_std::default_delete<mir::inst::OpInst>_>)
              local_2e8._0_8_ !=
              (__uniq_ptr_impl<mir::inst::OpInst,_std::default_delete<mir::inst::OpInst>_>)0x0) {
            (**(code **)(*(_func_int **)local_2e8._0_8_ + 0x28))();
          }
          std::unique_ptr<mir::inst::CallInst,_std::default_delete<mir::inst::CallInst>_>::
          ~unique_ptr((unique_ptr<mir::inst::CallInst,_std::default_delete<mir::inst::CallInst>_> *)
                      local_248);
          std::_Vector_base<mir::inst::Value,_std::allocator<mir::inst::Value>_>::~_Vector_base
                    ((_Vector_base<mir::inst::Value,_std::allocator<mir::inst::Value>_> *)local_2b8)
          ;
          std::__cxx11::string::~string((string *)local_298);
        }
        pvVar10 = std::
                  get<2ul,mir::inst::Op,optimization::common_expr_del::ExtraNormOp,optimization::common_expr_del::InNormOp>
                            (&((psVar26->
                               super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                               )._M_ptr)->op);
        if (*pvVar10 == Phi) {
          vStack_290.super__Variant_base<int,_mir::inst::VarId>.
          super__Move_assign_alias<int,_mir::inst::VarId>.
          super__Copy_assign_alias<int,_mir::inst::VarId>.
          super__Move_ctor_alias<int,_mir::inst::VarId>.
          super__Copy_ctor_alias<int,_mir::inst::VarId>.
          super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._8_8_ = (pointer)0x0;
          local_298 = (undefined1  [8])0x0;
          vStack_290.super__Variant_base<int,_mir::inst::VarId>.
          super__Move_assign_alias<int,_mir::inst::VarId>.
          super__Copy_assign_alias<int,_mir::inst::VarId>.
          super__Move_ctor_alias<int,_mir::inst::VarId>.
          super__Copy_ctor_alias<int,_mir::inst::VarId>.
          super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._0_8_ = (pointer)0x0;
          peVar2 = (psVar26->
                   super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr;
          pvVar3 = (peVar2->operands).
                   super__Vector_base<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (pvVar24 = *(pointer *)&peVar2->operands; pvVar24 != pvVar3; pvVar24 = pvVar24 + 1) {
            std::__detail::__variant::
            _Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)local_248,
                              (_Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)pvVar24);
            pvVar13 = std::get<1ul,int,optimization::common_expr_del::NodeId,std::__cxx11::string>
                                ((variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)local_248);
            std::__shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>::
            __shared_ptr((__shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                          *)local_2e8,
                         &(this->nodes).
                          super__Vector_base<std::shared_ptr<optimization::common_expr_del::Node>,_std::allocator<std::shared_ptr<optimization::common_expr_del::Node>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[pvVar13->id].
                          super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                        );
            local_2b8._0_8_ = &PTR_display_001d90d0;
            local_2b8._8_4_ = 0xffffffff;
            if (*(char *)(local_2e8._0_8_ + 0x40) == '\0') {
              if (*(_func_int **)(local_2e8._0_8_ + 0x58) != (_func_int *)0x0) {
                local_2b8._8_4_ = *(undefined4 *)(*(_func_int **)(local_2e8._0_8_ + 0x48) + 0x18);
                goto LAB_00125aea;
              }
              local_2b8._8_4_ = *(undefined4 *)(*(_func_int **)(local_2e8._0_8_ + 0x60) + 0x18);
              std::make_unique<mir::inst::AssignInst,mir::inst::VarId&,mir::inst::Value&>
                        ((VarId *)local_270,(Value *)local_2b8);
              local_260._M_head_impl = (Inst *)local_270._0_8_;
              local_270._0_8_ =
                   (__uniq_ptr_impl<mir::inst::AssignInst,_std::default_delete<mir::inst::AssignInst>_>
                    )0x0;
              std::
              vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
              ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                        (local_2c0,
                         (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                         &local_260);
              if (local_260._M_head_impl != (Inst *)0x0) {
                (*((local_260._M_head_impl)->super_Displayable)._vptr_Displayable[5])();
              }
              std::unique_ptr<mir::inst::AssignInst,_std::default_delete<mir::inst::AssignInst>_>::
              ~unique_ptr((unique_ptr<mir::inst::AssignInst,_std::default_delete<mir::inst::AssignInst>_>
                           *)local_270);
            }
            else {
              pvVar14 = std::get<1ul,int,mir::inst::VarId>
                                  ((variant<int,_mir::inst::VarId> *)(local_2e8._0_8_ + 0x30));
              local_2b8._8_4_ = pvVar14->id;
LAB_00125aea:
            }
            std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::push_back
                      ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)local_298,
                       (value_type *)local_2b8);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_2e8 + 8));
            std::__detail::__variant::
            _Variant_storage<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~_Variant_storage((_Variant_storage<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)local_248);
          }
          pvVar14 = std::get<1ul,int,mir::inst::VarId>
                              ((variant<int,_mir::inst::VarId> *)
                               &(((psVar26->
                                  super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                                  )._M_ptr)->mainVar).field_0x8);
          std::
          make_unique<mir::inst::PhiInst,mir::inst::VarId&,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>&>
                    ((VarId *)local_248,
                     (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)pvVar14);
          local_2e8._0_8_ = local_248;
          local_248 = (undefined1  [8])0x0;
          std::
          vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
          ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                    (local_2c0,
                     (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)local_2e8
                    );
          if ((__uniq_ptr_impl<mir::inst::OpInst,_std::default_delete<mir::inst::OpInst>_>)
              local_2e8._0_8_ !=
              (__uniq_ptr_impl<mir::inst::OpInst,_std::default_delete<mir::inst::OpInst>_>)0x0) {
            (**(code **)(*(_func_int **)local_2e8._0_8_ + 0x28))();
          }
          std::unique_ptr<mir::inst::PhiInst,_std::default_delete<mir::inst::PhiInst>_>::~unique_ptr
                    ((unique_ptr<mir::inst::PhiInst,_std::default_delete<mir::inst::PhiInst>_> *)
                     local_248);
          std::_Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::~_Vector_base
                    ((_Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)local_298)
          ;
          p_Var19 = local_2c8;
        }
        else {
          pvVar10 = std::
                    get<2ul,mir::inst::Op,optimization::common_expr_del::ExtraNormOp,optimization::common_expr_del::InNormOp>
                              (&((psVar26->
                                 super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                                 )._M_ptr)->op);
          if (*pvVar10 == Load) {
            pvVar13 = std::get<1ul,int,optimization::common_expr_del::NodeId,std::__cxx11::string>
                                (*(variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   **)&((psVar26->
                                        super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                                        )._M_ptr)->operands);
            mir::inst::Value::Value
                      ((Value *)local_248,
                       &((this->nodes).
                         super__Vector_base<std::shared_ptr<optimization::common_expr_del::Node>,_std::allocator<std::shared_ptr<optimization::common_expr_del::Node>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[pvVar13->id].
                         super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->mainVar);
            if (this->offset_inst == true) {
              std::__detail::__variant::
              _Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)&local_f8,
                                (_Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)(*(long *)&((psVar26->
                                               super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                                               )._M_ptr)->operands + 0x28));
              convert_operand_to_value((Value *)local_298,this,(Operand *)&local_f8);
              std::__detail::__variant::
              _Variant_storage<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~_Variant_storage(&local_f8);
              pVVar8 = (Value *)std::get<1ul,int,mir::inst::VarId>
                                          ((variant<int,_mir::inst::VarId> *)
                                           &(((psVar26->
                                              super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                                              )._M_ptr)->mainVar).field_0x8);
              std::
              make_unique<mir::inst::LoadOffsetInst,mir::inst::Value&,mir::inst::VarId&,mir::inst::Value&>
                        ((Value *)local_2e8,(VarId *)local_248,pVVar8);
              local_2b8._0_8_ = local_2e8._0_8_;
              local_2e8._0_8_ =
                   (__uniq_ptr_impl<mir::inst::OpInst,_std::default_delete<mir::inst::OpInst>_>)0x0;
              std::
              vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
              ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                        (local_2c0,
                         (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                         local_2b8);
              if ((Inst *)local_2b8._0_8_ != (Inst *)0x0) {
                (**(code **)(*(_func_int **)local_2b8._0_8_ + 0x28))();
              }
              std::
              unique_ptr<mir::inst::LoadOffsetInst,_std::default_delete<mir::inst::LoadOffsetInst>_>
              ::~unique_ptr((unique_ptr<mir::inst::LoadOffsetInst,_std::default_delete<mir::inst::LoadOffsetInst>_>
                             *)local_2e8);
              p_Var19 = local_2c8;
            }
            else {
              std::get<1ul,int,mir::inst::VarId>
                        ((variant<int,_mir::inst::VarId> *)
                         &(((psVar26->
                            super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                            )._M_ptr)->mainVar).field_0x8);
              std::make_unique<mir::inst::LoadInst,mir::inst::Value&,mir::inst::VarId&>
                        ((Value *)local_298,(VarId *)local_248);
              local_2e8._0_8_ = local_298;
              local_298 = (undefined1  [8])0x0;
              std::
              vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
              ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                        (local_2c0,
                         (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                         local_2e8);
              if ((__uniq_ptr_impl<mir::inst::OpInst,_std::default_delete<mir::inst::OpInst>_>)
                  local_2e8._0_8_ !=
                  (__uniq_ptr_impl<mir::inst::OpInst,_std::default_delete<mir::inst::OpInst>_>)0x0)
              {
                (**(code **)(*(_func_int **)local_2e8._0_8_ + 0x28))();
              }
              std::unique_ptr<mir::inst::LoadInst,_std::default_delete<mir::inst::LoadInst>_>::
              ~unique_ptr((unique_ptr<mir::inst::LoadInst,_std::default_delete<mir::inst::LoadInst>_>
                           *)local_298);
              p_Var19 = local_2c8;
            }
          }
          else {
            pvVar10 = std::
                      get<2ul,mir::inst::Op,optimization::common_expr_del::ExtraNormOp,optimization::common_expr_del::InNormOp>
                                (&((psVar26->
                                   super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_ptr)->op);
            p_Var19 = local_2c8;
            if (*pvVar10 == Store) {
              std::__detail::__variant::
              _Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)&local_120,
                                *(_Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  **)&((psVar26->
                                       super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                                       )._M_ptr)->operands);
              convert_operand_to_value((Value *)local_248,this,(Operand *)&local_120);
              std::__detail::__variant::
              _Variant_storage<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~_Variant_storage(&local_120);
              std::__detail::__variant::
              _Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)&local_148,
                                (_Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)(*(long *)&((psVar26->
                                               super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                                               )._M_ptr)->operands + 0x28));
              convert_operand_to_value((Value *)local_298,this,(Operand *)&local_148);
              std::__detail::__variant::
              _Variant_storage<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~_Variant_storage(&local_148);
              if (this->offset_inst == true) {
                std::__detail::__variant::
                _Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)&local_170,
                                  (_Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)(*(long *)&((psVar26->
                                                 super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                                                 )._M_ptr)->operands + 0x50));
                convert_operand_to_value((Value *)local_2e8,this,(Operand *)&local_170);
                std::__detail::__variant::
                _Variant_storage<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~_Variant_storage(&local_170);
                pVVar8 = (Value *)std::get<1ul,int,mir::inst::VarId>(&vStack_290);
                std::
                make_unique<mir::inst::StoreOffsetInst,mir::inst::Value&,mir::inst::VarId&,mir::inst::Value&>
                          ((Value *)local_2b8,(VarId *)local_248,pVVar8);
                local_270._0_8_ = local_2b8._0_8_;
                local_2b8._0_8_ = (Inst *)0x0;
                std::
                vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                ::
                emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                          (local_2c0,
                           (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                           local_270);
                if ((__uniq_ptr_impl<mir::inst::AssignInst,_std::default_delete<mir::inst::AssignInst>_>
                     )local_270._0_8_ !=
                    (__uniq_ptr_impl<mir::inst::AssignInst,_std::default_delete<mir::inst::AssignInst>_>
                     )0x0) {
                  (**(code **)(*(_func_int **)local_270._0_8_ + 0x28))();
                }
                std::
                unique_ptr<mir::inst::StoreOffsetInst,_std::default_delete<mir::inst::StoreOffsetInst>_>
                ::~unique_ptr((unique_ptr<mir::inst::StoreOffsetInst,_std::default_delete<mir::inst::StoreOffsetInst>_>
                               *)local_2b8);
                p_Var19 = local_2c8;
              }
              else {
                std::get<1ul,int,mir::inst::VarId>(&vStack_290);
                std::make_unique<mir::inst::StoreInst,mir::inst::Value&,mir::inst::VarId&>
                          ((Value *)local_2e8,(VarId *)local_248);
                local_2b8._0_8_ = local_2e8._0_8_;
                local_2e8._0_8_ =
                     (__uniq_ptr_impl<mir::inst::OpInst,_std::default_delete<mir::inst::OpInst>_>)
                     0x0;
                std::
                vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                ::
                emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                          (local_2c0,
                           (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                           local_2b8);
                if ((Inst *)local_2b8._0_8_ != (Inst *)0x0) {
                  (**(code **)(*(_func_int **)local_2b8._0_8_ + 0x28))();
                }
                std::unique_ptr<mir::inst::StoreInst,_std::default_delete<mir::inst::StoreInst>_>::
                ~unique_ptr((unique_ptr<mir::inst::StoreInst,_std::default_delete<mir::inst::StoreInst>_>
                             *)local_2e8);
                p_Var19 = local_2c8;
              }
            }
          }
        }
      }
      else if (_Var1 == '\x01') {
        pvVar9 = std::
                 get<1ul,mir::inst::Op,optimization::common_expr_del::ExtraNormOp,optimization::common_expr_del::InNormOp>
                           (&peVar2->op);
        p_Var19 = local_2c8;
        switch(*pvVar9) {
        case Ref:
          local_248 = (undefined1  [8])&PTR_display_001d90d0;
          local_240.super__Variant_base<int,_mir::inst::VarId>.
          super__Move_assign_alias<int,_mir::inst::VarId>.
          super__Copy_assign_alias<int,_mir::inst::VarId>.
          super__Move_ctor_alias<int,_mir::inst::VarId>.
          super__Copy_ctor_alias<int,_mir::inst::VarId>.
          super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._M_first._M_storage =
               (_Uninitialized<int,_true>)-1;
          local_228 = '\0';
          __v = *(variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  **)&((psVar26->
                       super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr)->operands;
          if ((__v->
              super__Variant_base<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ).
              super__Move_assign_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
              .
              super__Copy_assign_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
              .
              super__Move_ctor_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
              .
              super__Copy_ctor_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
              .
              super__Variant_storage_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
              ._M_index == '\x01') {
            pvVar13 = std::get<1ul,int,optimization::common_expr_del::NodeId,std::__cxx11::string>
                                (__v);
            pvVar14 = std::get<1ul,int,mir::inst::VarId>
                                ((variant<int,_mir::inst::VarId> *)
                                 &(((this->nodes).
                                    super__Vector_base<std::shared_ptr<optimization::common_expr_del::Node>,_std::allocator<std::shared_ptr<optimization::common_expr_del::Node>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[pvVar13->id].
                                    super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->mainVar).field_0x8);
            std::variant<mir::inst::VarId,std::__cxx11::string>::operator=
                      ((variant<mir::inst::VarId,std::__cxx11::string> *)local_248,pvVar14);
          }
          else {
            pvVar11 = std::get<2ul,int,optimization::common_expr_del::NodeId,std::__cxx11::string>
                                (__v);
            std::variant<mir::inst::VarId,std::__cxx11::string>::operator=
                      ((variant<mir::inst::VarId,std::__cxx11::string> *)local_248,pvVar11);
          }
          pvVar14 = std::get<1ul,int,mir::inst::VarId>
                              ((variant<int,_mir::inst::VarId> *)
                               &(((psVar26->
                                  super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                                  )._M_ptr)->mainVar).field_0x8);
          std::
          make_unique<mir::inst::RefInst,mir::inst::VarId&,std::variant<mir::inst::VarId,std::__cxx11::string>&>
                    ((VarId *)local_2e8,
                     (variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)pvVar14);
          local_298 = (undefined1  [8])local_2e8._0_8_;
          local_2e8._0_8_ =
               (__uniq_ptr_impl<mir::inst::OpInst,_std::default_delete<mir::inst::OpInst>_>)0x0;
          std::
          vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
          ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                    (local_2c0,
                     (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)local_298
                    );
          if ((__uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>)local_298 !=
              (__uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>)0x0) {
            (**(code **)(*(_func_int **)local_298 + 0x28))();
          }
          local_298 = (undefined1  [8])0x0;
          std::unique_ptr<mir::inst::RefInst,_std::default_delete<mir::inst::RefInst>_>::~unique_ptr
                    ((unique_ptr<mir::inst::RefInst,_std::default_delete<mir::inst::RefInst>_> *)
                     local_2e8);
          std::__detail::__variant::
          _Variant_storage<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~_Variant_storage((_Variant_storage<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)local_248);
          p_Var19 = local_2c8;
          break;
        case Ptroffset:
          std::__detail::__variant::
          _Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&local_a8,
                            *(_Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              **)&((psVar26->
                                   super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_ptr)->operands);
          convert_operand_to_value((Value *)local_248,this,(Operand *)&local_a8);
          pvVar14 = std::get<1ul,int,mir::inst::VarId>(&local_240);
          local_298 = (undefined1  [8])&PTR_display_001d90d0;
          vStack_290.super__Variant_base<int,_mir::inst::VarId>.
          super__Move_assign_alias<int,_mir::inst::VarId>.
          super__Copy_assign_alias<int,_mir::inst::VarId>.
          super__Move_ctor_alias<int,_mir::inst::VarId>.
          super__Copy_ctor_alias<int,_mir::inst::VarId>.
          super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._M_first._M_storage =
               (_Uninitialized<int,_true>)pvVar14->id;
          std::__detail::__variant::
          _Variant_storage<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~_Variant_storage(&local_a8);
          std::__detail::__variant::
          _Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&local_d0,
                            (_Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)(*(long *)&((psVar26->
                                           super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                                           )._M_ptr)->operands + 0x28));
          convert_operand_to_value((Value *)local_248,this,(Operand *)&local_d0);
          std::__detail::__variant::
          _Variant_storage<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~_Variant_storage(&local_d0);
          pvVar14 = std::get<1ul,int,mir::inst::VarId>
                              ((variant<int,_mir::inst::VarId> *)
                               &(((psVar26->
                                  super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                                  )._M_ptr)->mainVar).field_0x8);
          std::
          make_unique<mir::inst::PtrOffsetInst,mir::inst::VarId&,mir::inst::VarId&,mir::inst::Value&>
                    ((VarId *)local_2e8,pvVar14,(Value *)local_298);
          local_2b8._0_8_ = local_2e8._0_8_;
          local_2e8._0_8_ =
               (__uniq_ptr_impl<mir::inst::OpInst,_std::default_delete<mir::inst::OpInst>_>)0x0;
          std::
          vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
          ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                    (local_2c0,
                     (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)local_2b8
                    );
          if ((Inst *)local_2b8._0_8_ != (Inst *)0x0) {
            (**(code **)(*(_func_int **)local_2b8._0_8_ + 0x28))();
          }
          std::unique_ptr<mir::inst::PtrOffsetInst,_std::default_delete<mir::inst::PtrOffsetInst>_>
          ::~unique_ptr((unique_ptr<mir::inst::PtrOffsetInst,_std::default_delete<mir::inst::PtrOffsetInst>_>
                         *)local_2e8);
          p_Var19 = local_2c8;
          break;
        case Assign:
          vStack_290.super__Variant_base<int,_mir::inst::VarId>.
          super__Move_assign_alias<int,_mir::inst::VarId>.
          super__Copy_assign_alias<int,_mir::inst::VarId>.
          super__Move_ctor_alias<int,_mir::inst::VarId>.
          super__Copy_ctor_alias<int,_mir::inst::VarId>.
          super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._0_8_ =
               vStack_290.super__Variant_base<int,_mir::inst::VarId>.
               super__Move_assign_alias<int,_mir::inst::VarId>.
               super__Copy_assign_alias<int,_mir::inst::VarId>.
               super__Move_ctor_alias<int,_mir::inst::VarId>.
               super__Copy_ctor_alias<int,_mir::inst::VarId>.
               super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._0_8_ & 0xffffffff00000000;
          vStack_290.super__Variant_base<int,_mir::inst::VarId>.
          super__Move_assign_alias<int,_mir::inst::VarId>.
          super__Copy_assign_alias<int,_mir::inst::VarId>.
          super__Move_ctor_alias<int,_mir::inst::VarId>.
          super__Copy_ctor_alias<int,_mir::inst::VarId>.
          super__Variant_storage_alias<int,_mir::inst::VarId>._M_index = '\0';
          local_298 = (undefined1  [8])local_258._M_head_impl;
          vStack_290.super__Variant_base<int,_mir::inst::VarId>.
          super__Move_assign_alias<int,_mir::inst::VarId>.
          super__Copy_assign_alias<int,_mir::inst::VarId>.
          super__Move_ctor_alias<int,_mir::inst::VarId>.
          super__Copy_ctor_alias<int,_mir::inst::VarId>.
          super__Variant_storage_alias<int,_mir::inst::VarId>._17_2_ = 1;
          std::__detail::__variant::
          _Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_248,
                            *(_Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              **)&((psVar26->
                                   super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_ptr)->operands);
          if (local_228 == '\x01') {
            pvVar13 = std::get<1ul,int,optimization::common_expr_del::NodeId,std::__cxx11::string>
                                (*(variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   **)&((psVar26->
                                        super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                                        )._M_ptr)->operands);
            mir::inst::Value::operator=
                      ((Value *)local_298,
                       &((this->nodes).
                         super__Vector_base<std::shared_ptr<optimization::common_expr_del::Node>,_std::allocator<std::shared_ptr<optimization::common_expr_del::Node>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[pvVar13->id].
                         super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->mainVar);
          }
          else {
            puVar15 = (uint32_t *)
                      std::get<0ul,int,optimization::common_expr_del::NodeId,std::__cxx11::string>
                                ((variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)local_248);
            local_2e8._8_4_ = *puVar15;
            local_2d0 = 0;
            local_2e8._0_8_ = local_258._M_head_impl;
            local_2cf._0_1_ = Lsl;
            local_2cf._1_1_ = '\0';
            mir::inst::Value::operator=((Value *)local_298,(Value *)local_2e8);
          }
          pVVar8 = (Value *)std::get<1ul,int,mir::inst::VarId>
                                      ((variant<int,_mir::inst::VarId> *)
                                       &(((psVar26->
                                          super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                                          )._M_ptr)->mainVar).field_0x8);
          std::make_unique<mir::inst::AssignInst,mir::inst::VarId&,mir::inst::Value&>
                    ((VarId *)local_2e8,pVVar8);
          local_2b8._0_8_ = local_2e8._0_8_;
          local_2e8._0_8_ =
               (__uniq_ptr_impl<mir::inst::OpInst,_std::default_delete<mir::inst::OpInst>_>)0x0;
          std::
          vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
          ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                    (local_2c0,
                     (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)local_2b8
                    );
          if ((Inst *)local_2b8._0_8_ != (Inst *)0x0) {
            (**(code **)(*(_func_int **)local_2b8._0_8_ + 0x28))();
          }
          std::unique_ptr<mir::inst::AssignInst,_std::default_delete<mir::inst::AssignInst>_>::
          ~unique_ptr((unique_ptr<mir::inst::AssignInst,_std::default_delete<mir::inst::AssignInst>_>
                       *)local_2e8);
          std::__detail::__variant::
          _Variant_storage<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~_Variant_storage((_Variant_storage<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)local_248);
          p_Var19 = local_2c8;
          break;
        case Call:
          pvVar11 = std::get<2ul,int,optimization::common_expr_del::NodeId,std::__cxx11::string>
                              ((((psVar26->
                                 super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                                 )._M_ptr)->operands).
                               super__Vector_base<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish + 0xffffffffffffffff);
          std::__cxx11::string::string((string *)local_298,(string *)pvVar11);
          std::
          vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::pop_back(&((psVar26->
                       super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr)->operands);
          local_2a8 = (pointer)0x0;
          local_2b8._0_8_ =
               (__uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>)0x0;
          local_2b8._8_8_ = (pointer)0x0;
          peVar2 = (psVar26->
                   super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr;
          pvVar3 = (peVar2->operands).
                   super__Vector_base<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (pvVar24 = *(pointer *)&peVar2->operands; pvVar24 != pvVar3; pvVar24 = pvVar24 + 1) {
            std::__detail::__variant::
            _Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)local_248,
                              (_Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)pvVar24);
            std::__detail::__variant::
            _Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&local_198,
                              (_Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)local_248);
            convert_operand_to_value((Value *)local_2e8,this,(Operand *)&local_198);
            std::vector<mir::inst::Value,_std::allocator<mir::inst::Value>_>::
            emplace_back<mir::inst::Value>
                      ((vector<mir::inst::Value,_std::allocator<mir::inst::Value>_> *)local_2b8,
                       (Value *)local_2e8);
            std::__detail::__variant::
            _Variant_storage<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~_Variant_storage(&local_198);
            std::__detail::__variant::
            _Variant_storage<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~_Variant_storage((_Variant_storage<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)local_248);
          }
          pbVar12 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    std::get<1ul,int,mir::inst::VarId>
                              ((variant<int,_mir::inst::VarId> *)
                               &(((psVar26->
                                  super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                                  )._M_ptr)->mainVar).field_0x8);
          std::
          make_unique<mir::inst::CallInst,mir::inst::VarId&,std::__cxx11::string&,std::vector<mir::inst::Value,std::allocator<mir::inst::Value>>&>
                    ((VarId *)local_248,pbVar12,
                     (vector<mir::inst::Value,_std::allocator<mir::inst::Value>_> *)local_298);
          local_2e8._0_8_ = local_248;
          local_248 = (undefined1  [8])0x0;
          std::
          vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
          ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                    (local_2c0,
                     (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)local_2e8
                    );
          if ((__uniq_ptr_impl<mir::inst::OpInst,_std::default_delete<mir::inst::OpInst>_>)
              local_2e8._0_8_ !=
              (__uniq_ptr_impl<mir::inst::OpInst,_std::default_delete<mir::inst::OpInst>_>)0x0) {
            (**(code **)(*(_func_int **)local_2e8._0_8_ + 0x28))();
          }
          std::unique_ptr<mir::inst::CallInst,_std::default_delete<mir::inst::CallInst>_>::
          ~unique_ptr((unique_ptr<mir::inst::CallInst,_std::default_delete<mir::inst::CallInst>_> *)
                      local_248);
          std::_Vector_base<mir::inst::Value,_std::allocator<mir::inst::Value>_>::~_Vector_base
                    ((_Vector_base<mir::inst::Value,_std::allocator<mir::inst::Value>_> *)local_2b8)
          ;
          std::__cxx11::string::~string((string *)local_298);
          p_Var19 = local_2c8;
        }
      }
      else if (_Var1 == '\0') {
        std::__detail::__variant::
        _Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&local_58,
                          *(_Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            **)&peVar2->operands);
        convert_operand_to_value((Value *)local_248,this,(Operand *)&local_58);
        std::__detail::__variant::
        _Variant_storage<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~_Variant_storage(&local_58);
        std::__detail::__variant::
        _Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&local_80,
                          (_Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)(*(long *)&((psVar26->
                                         super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                                         )._M_ptr)->operands + 0x28));
        convert_operand_to_value((Value *)local_298,this,(Operand *)&local_80);
        std::__detail::__variant::
        _Variant_storage<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~_Variant_storage(&local_80);
        pVVar8 = (Value *)std::get<1ul,int,mir::inst::VarId>
                                    ((variant<int,_mir::inst::VarId> *)
                                     &(((psVar26->
                                        super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                                        )._M_ptr)->mainVar).field_0x8);
        std::
        get<0ul,mir::inst::Op,optimization::common_expr_del::ExtraNormOp,optimization::common_expr_del::InNormOp>
                  (&((psVar26->
                     super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr)->op);
        std::
        make_unique<mir::inst::OpInst,mir::inst::VarId&,mir::inst::Value&,mir::inst::Value&,mir::inst::Op&>
                  ((VarId *)local_2e8,pVVar8,(Value *)local_248,(Op *)local_298);
        local_2b8._0_8_ = local_2e8._0_8_;
        local_2e8._0_8_ =
             (__uniq_ptr_impl<mir::inst::OpInst,_std::default_delete<mir::inst::OpInst>_>)0x0;
        std::
        vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
        ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                  (local_2c0,
                   (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)local_2b8);
        if ((Inst *)local_2b8._0_8_ != (Inst *)0x0) {
          (**(code **)(*(_func_int **)local_2b8._0_8_ + 0x28))();
        }
        std::unique_ptr<mir::inst::OpInst,_std::default_delete<mir::inst::OpInst>_>::~unique_ptr
                  ((unique_ptr<mir::inst::OpInst,_std::default_delete<mir::inst::OpInst>_> *)
                   local_2e8);
        p_Var19 = local_2c8;
      }
    }
  }
  p_Var19 = (_List_node_base *)local_270._8_8_;
  while (pBVar6 = local_250, p_Var19 = p_Var19->_M_next,
        p_Var19 != (_List_node_base *)local_270._8_8_) {
    peVar2 = (this->nodes).
             super__Vector_base<std::shared_ptr<optimization::common_expr_del::Node>,_std::allocator<std::shared_ptr<optimization::common_expr_del::Node>_>_>
             ._M_impl.super__Vector_impl_data._M_start[*(uint *)&p_Var19[1]._M_next].
             super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if ((peVar2->live_vars).super__List_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
        _M_impl._M_node._M_size != 0) {
      plVar22 = &peVar2->live_vars;
      plVar20 = plVar22;
      local_2c8 = p_Var19;
      while (plVar20 = *(list<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> **)
                        &plVar20->
                         super__List_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,
            p_Var19 = local_2c8, plVar20 != plVar22) {
        local_248 = (undefined1  [8])&PTR_display_001d90d0;
        local_240.super__Variant_base<int,_mir::inst::VarId>.
        super__Move_assign_alias<int,_mir::inst::VarId>.
        super__Copy_assign_alias<int,_mir::inst::VarId>.
        super__Move_ctor_alias<int,_mir::inst::VarId>.super__Copy_ctor_alias<int,_mir::inst::VarId>.
        super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._M_first._M_storage =
             (_Uninitialized<int,_true>)
             *(undefined4 *)
              &plVar20[1].super__List_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>;
        std::make_unique<mir::inst::AssignInst,mir::inst::VarId&,mir::inst::Value&>
                  ((VarId *)local_298,(Value *)local_248);
        local_2e8._0_8_ = local_298;
        local_298 = (undefined1  [8])0x0;
        std::
        vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
        ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                  (local_2c0,
                   (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)local_2e8);
        if ((__uniq_ptr_impl<mir::inst::OpInst,_std::default_delete<mir::inst::OpInst>_>)
            local_2e8._0_8_ !=
            (__uniq_ptr_impl<mir::inst::OpInst,_std::default_delete<mir::inst::OpInst>_>)0x0) {
          (**(code **)(*(_func_int **)local_2e8._0_8_ + 0x28))();
        }
        std::unique_ptr<mir::inst::AssignInst,_std::default_delete<mir::inst::AssignInst>_>::
        ~unique_ptr((unique_ptr<mir::inst::AssignInst,_std::default_delete<mir::inst::AssignInst>_>
                     *)local_298);
      }
    }
  }
  if ((local_250->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
      super__Optional_payload_base<mir::inst::VarId>._M_engaged != false) {
    this_00 = &(local_250->jump).cond_or_ret;
    pVVar16 = std::optional<mir::inst::VarId>::value(this_00);
    if (pVVar16->id != 0) {
      pVVar16 = std::optional<mir::inst::VarId>::value(this_00);
      local_298 = (undefined1  [8])&PTR_display_001d90d0;
      vStack_290.super__Variant_base<int,_mir::inst::VarId>.
      super__Move_assign_alias<int,_mir::inst::VarId>.
      super__Copy_assign_alias<int,_mir::inst::VarId>.super__Move_ctor_alias<int,_mir::inst::VarId>.
      super__Copy_ctor_alias<int,_mir::inst::VarId>.
      super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._M_first._M_storage =
           (_Uninitialized<int,_true>)pVVar16->id;
      pmVar17 = std::
                map<mir::inst::VarId,_optimization::common_expr_del::NodeId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_optimization::common_expr_del::NodeId>_>_>
                ::operator[](&this->var_map,(key_type *)local_298);
      pvVar14 = std::get<1ul,int,mir::inst::VarId>
                          ((variant<int,_mir::inst::VarId> *)
                           &(((this->nodes).
                              super__Vector_base<std::shared_ptr<optimization::common_expr_del::Node>,_std::allocator<std::shared_ptr<optimization::common_expr_del::Node>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[pmVar17->id].
                              super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->mainVar).field_0x8);
      uVar23 = pvVar14->id;
      if ((pBVar6->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>._M_payload
          .super__Optional_payload_base<mir::inst::VarId>._M_engaged == false) {
        (pBVar6->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
        super__Optional_payload_base<mir::inst::VarId>._M_payload._M_value.super_Displayable.
        _vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
        (pBVar6->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
        super__Optional_payload_base<mir::inst::VarId>._M_engaged = true;
      }
      (pBVar6->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
      super__Optional_payload_base<mir::inst::VarId>._M_payload._M_value.id = uVar23;
      __args = (pBVar6->inst).
               super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar21 = (long)__args * -0x20000000;
      for (; __args != (pBVar6->inst).
                       super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish; __args = __args + 1) {
        pIVar4 = (__args->_M_t).
                 super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>._M_t.
                 super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
                 super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl;
        if (((pIVar4->dest).id == uVar23) &&
           (iVar7 = (*(pIVar4->super_Displayable)._vptr_Displayable[1])(), this_01 = local_2c0,
           iVar7 == 1)) {
          lVar5 = *(long *)local_2c0;
          std::
          vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
          ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                    (local_2c0,__args);
          std::
          vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
          ::erase((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                   *)this_01,
                  (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                  ((-(lVar5 * 0x20000000 + lVar21) >> 0x1d) + *(long *)this_01));
          break;
        }
        lVar21 = lVar21 + -0x100000000;
      }
      var_replace::Var_Replace::Var_Replace((Var_Replace *)local_248,(MirFunction *)*env);
      p_Var19 = (_List_node_base *)local_270._8_8_;
LAB_0012645a:
      do {
        do {
          p_Var19 = p_Var19->_M_next;
          if (p_Var19 == (_List_node_base *)local_270._8_8_) {
            var_replace::Var_Replace::~Var_Replace((Var_Replace *)local_248);
            return;
          }
          uVar25 = *(uint *)&p_Var19[1]._M_next;
          psVar26 = (this->nodes).
                    super__Vector_base<std::shared_ptr<optimization::common_expr_del::Node>,_std::allocator<std::shared_ptr<optimization::common_expr_del::Node>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          peVar2 = psVar26[uVar25].
                   super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
        } while ((peVar2->live_vars).
                 super__List_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
                 _M_node._M_size == 0);
        plVar20 = &peVar2->live_vars;
        if ((peVar2->mainVar).field_0x18 == '\0') goto LAB_001264f2;
        pvVar14 = std::get<1ul,int,mir::inst::VarId>
                            ((variant<int,_mir::inst::VarId> *)&(peVar2->mainVar).field_0x8);
        local_2e8._0_8_ = &PTR_display_001d90d0;
        local_2e8._8_4_ = pvVar14->id;
        pmVar18 = std::
                  map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                  ::at((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                        *)(*env + 0x38),(key_type_conflict *)(local_2e8 + 8));
        uVar23 = local_2e8._8_4_;
      } while (pmVar18->is_phi_var != false);
      pmVar18 = std::
                map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                ::at((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                      *)(*env + 0x38),(key_type_conflict *)(local_2e8 + 8));
      pmVar18->is_temp_var = false;
      goto LAB_00126537;
    }
  }
  return;
LAB_001264f2:
  do {
    plVar20 = *(list<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> **)
               &plVar20->super__List_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>;
    if (plVar20 == &peVar2->live_vars) goto LAB_0012645a;
    local_2e8._0_8_ = &PTR_display_001d90d0;
    local_2e8._8_4_ =
         *(undefined4 *)
          &plVar20[1].super__List_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>;
    pmVar18 = std::
              map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
              ::at((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                    *)(*env + 0x38),(key_type_conflict *)(local_2e8 + 8));
    uVar23 = local_2e8._8_4_;
  } while (pmVar18->is_phi_var != false);
LAB_00126537:
  plVar22 = &(psVar26[uVar25].
              super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->live_vars;
  plVar20 = plVar22;
  while (plVar20 = *(list<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> **)
                    &plVar20->super__List_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,
        plVar20 != plVar22) {
    local_2e8._0_8_ = &PTR_display_001d90d0;
    local_2e8._8_4_ =
         *(undefined4 *)
          &plVar20[1].super__List_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>;
    pmVar18 = std::
              map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
              ::at((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                    *)(*env + 0x38),(key_type_conflict *)(local_2e8 + 8));
    if ((pmVar18->is_phi_var == false) && (local_2e8._8_4_ != uVar23)) {
      local_1d0.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
      local_1d0.id = local_2e8._8_4_;
      local_1e0.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
      local_1e0.id = uVar23;
      var_replace::Var_Replace::replace((Var_Replace *)local_248,&local_1d0,&local_1e0);
    }
  }
  goto LAB_0012645a;
}

Assistant:

void export_insts(mir::inst::BasicBlk& block) {
    auto& inst = block.inst;
    for (auto iter = nodes.begin(); iter != nodes.end(); ++iter) {
      iter->get()->init_main_var();
    }
    while (added.size() < nodes.size()) {
      for (int i = nodes.size() - 1; i >= 0; --i) {
        exportNode(i);
      }
    }
    inst.clear();
    // for (auto& varpair : var_map) {
    //   if (varpair.first > 10000) {
    //     break;
    //   }
    //   if (varpair.first >= 1) {
    //     inst.push_back(std::make_unique<mir::inst::AssignInst>(
    //         std::get<mir::inst::VarId>(nodes[varpair.second.id]->mainVar),
    //         varpair.first));
    //   }
    // }
    std::reverse(exportQueue.begin(), exportQueue.end());
    for (auto idx : exportQueue) {
      auto& node = nodes[idx];
      if (!node->is_leaf) {
        auto opKind = node->op.index();
        switch (opKind) {
          case 0: {
            auto lhs = convert_operand_to_value(node->operands[0]);
            auto rhs = convert_operand_to_value(node->operands[1]);
            auto opInst = std::make_unique<mir::inst::OpInst>(
                std::get<mir::inst::VarId>(node->mainVar), lhs, rhs,
                std::get<NormOp>(node->op));
            inst.push_back(std::move(opInst));
            break;
          }

          case 1: {
            switch (std::get<ExtraNormOp>(node->op)) {
              case ExtraNormOp::Ref: {
                std::variant<mir::inst::VarId, std::string> val;
                if (node->operands[0].index() == 1) {
                  val = std::get<mir::inst::VarId>(
                      nodes[std::get<NodeId>(node->operands[0]).id]->mainVar);
                  //这里可能的VarId是局部数组，理论上不会出现int成为mainVar的情况

                } else {
                  val = std::get<std::string>(node->operands[0]);
                }
                inst.push_back(std::make_unique<mir::inst::RefInst>(
                    std::get<mir::inst::VarId>(node->mainVar), val));
                break;
              }
              case ExtraNormOp::Ptroffset: {
                auto ptr = std::get<mir::inst::VarId>(
                    convert_operand_to_value(node->operands[0]));
                auto offset = convert_operand_to_value(node->operands[1]);
                auto ptrInst = std::make_unique<mir::inst::PtrOffsetInst>(
                    std::get<mir::inst::VarId>(node->mainVar), ptr, offset);
                inst.push_back(std::move(ptrInst));
                break;
              }
              case ExtraNormOp::Assign: {
                mir::inst::Value src(0);
                auto operand = node->operands[0];
                if (operand.index() == 1) {
                  auto srcId = std::get<NodeId>(node->operands[0]);
                  src = nodes[srcId.id]->mainVar;
                } else {
                  src = std::get<int>(operand);
                }

                auto assignInst = std::make_unique<mir::inst::AssignInst>(
                    std::get<mir::inst::VarId>(node->mainVar), src);
                inst.push_back(std::move(assignInst));
                break;
              }
              case ExtraNormOp::Call: {
                auto func = std::get<std::string>(
                    node->operands[node->operands.size() - 1]);
                node->operands.pop_back();
                std::vector<mir::inst::Value> params;
                for (auto operand : node->operands) {
                  params.push_back(convert_operand_to_value(operand));
                }
                auto callInst = std::make_unique<mir::inst::CallInst>(
                    std::get<mir::inst::VarId>(node->mainVar), func, params);
                inst.push_back(std::move(callInst));
              }
            }

            break;
          }

          case 2: {
            if (std::get<InNormOp>(node->op) == InNormOp::Call) {
              auto func = std::get<std::string>(
                  node->operands[node->operands.size() - 1]);
              node->operands.pop_back();
              std::vector<mir::inst::Value> params;
              for (auto operand : node->operands) {
                params.push_back(convert_operand_to_value(operand));
              }
              auto callInst = std::make_unique<mir::inst::CallInst>(
                  std::get<mir::inst::VarId>(node->mainVar), func, params);
              inst.push_back(std::move(callInst));
            }
            if (std::get<InNormOp>(node->op) == InNormOp::Phi) {
              std::vector<mir::inst::VarId> vars;
              for (auto operand : node->operands) {
                auto oper_node = nodes[std::get<NodeId>(operand).id];
                mir::inst::VarId var;
                if (oper_node->mainVar.index() == 0) {
                  // imm

                  if (oper_node->live_vars.size()) {
                    var = oper_node->live_vars.front();
                  } else {
                    var = oper_node->local_vars.front();
                    auto assignInst = std::make_unique<mir::inst::AssignInst>(
                        var, node->mainVar);
                    inst.push_back(std::move(assignInst));
                  }
                } else {
                  var = std::get<mir::inst::VarId>(oper_node->mainVar);
                }
                vars.push_back(var);
              }
              auto phiInst = std::make_unique<mir::inst::PhiInst>(
                  std::get<mir::inst::VarId>(node->mainVar), vars);
              inst.push_back(std::move(phiInst));
            } else if (std::get<InNormOp>(node->op) == InNormOp::Load) {
              auto src = nodes[std::get<NodeId>(node->operands[0]).id]->mainVar;
              if (offset_inst) {
                auto offset = convert_operand_to_value(node->operands[1]);
                auto loadInst = std::make_unique<mir::inst::LoadOffsetInst>(
                    src, std::get<mir::inst::VarId>(node->mainVar), offset);
                inst.push_back(std::move(loadInst));
              } else {
                auto loadInst = std::make_unique<mir::inst::LoadInst>(
                    src, std::get<mir::inst::VarId>(node->mainVar));
                inst.push_back(std::move(loadInst));
              }

            } else if (std::get<InNormOp>(node->op) == InNormOp::Store) {
              auto val = convert_operand_to_value(node->operands[0]);
              auto dest = convert_operand_to_value(node->operands[1]);
              if (offset_inst) {
                auto offset = convert_operand_to_value(node->operands[2]);
                auto loadInst = std::make_unique<mir::inst::StoreOffsetInst>(
                    val, std::get<mir::inst::VarId>(dest), offset);
                inst.push_back(std::move(loadInst));
              } else {
                auto storeInst = std::make_unique<mir::inst::StoreInst>(
                    val, std::get<mir::inst::VarId>(dest));
                inst.push_back(std::move(storeInst));
              }
            }
            break;
          }
          default:;
        }
      }
      // if (node->live_vars.size()) {
      //   for (auto var : node->live_vars) {
      //     //
      //     if(node->op.index()==1&&std::get<ExtraNormOp>(node->op)==ExtraNormOp::Assign&&node->operands)
      //     auto assignInst =
      //         std::make_unique<mir::inst::AssignInst>(var, node->mainVar);
      //     inst.push_back(std::move(assignInst));
      //   }
      // }
    }
    // this must be in the end, or the livevar might overides the leaf var used
    // after this because they share the same reg
    for (auto idx : exportQueue) {
      auto& node = nodes[idx];
      if (node->live_vars.size()) {
        for (auto var : node->live_vars) {
          auto assignInst =
              std::make_unique<mir::inst::AssignInst>(var, node->mainVar);
          inst.push_back(std::move(assignInst));
        }
      }
    }

    auto& jump = block.jump;
    if (!jump.cond_or_ret.has_value() || jump.cond_or_ret.value().id == 0) {
      return;
    }
    auto varId = jump.cond_or_ret.value();
    auto& node = nodes[var_map[varId].id];
    mir::inst::VarId var = std::get<mir::inst::VarId>(node->mainVar);
    jump.cond_or_ret = var;
    for (auto iter = block.inst.begin(); iter != block.inst.end();) {
      auto& inst = *iter;
      if (inst->dest == var && inst->inst_kind() == mir::inst::InstKind::Op) {
        int idx = iter - block.inst.begin();
        block.inst.push_back(std::move(inst));
        iter = block.inst.begin() + idx;
        iter = block.inst.erase(iter);

        break;
      } else {
        iter++;
      }
    }

    // replace
    var_replace::Var_Replace vp(env->func);
    for (auto idx : exportQueue) {
      auto& node = nodes[idx];
      if (node->live_vars.size()) {
        std::optional<mir::inst::VarId> not_phi_var;
        if (!node->mainVar.is_immediate()) {
          auto var = std::get<mir::inst::VarId>(node->mainVar);
          if (!env->func.variables.at(var.id).is_phi_var) {
            not_phi_var = var;
            env->func.variables.at(var.id).is_temp_var = false;
          }
        } else {
          for (auto var : node->live_vars) {
            if (!env->func.variables.at(var.id).is_phi_var) {
              not_phi_var = var;
              break;
            }
          }
        }

        if (not_phi_var.has_value()) {
          for (auto var : node->live_vars) {
            if (!env->func.variables.at(var.id).is_phi_var &&
                var != not_phi_var.value()) {
              vp.replace(var, not_phi_var.value());
            }
          }
        }
      }
    }
  }